

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int ncnn::
    reduction<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,bool post_process,
              float coeff,int keepdims,Option *opt)

{
  int iVar1;
  byte in_R9B;
  double dVar2;
  float in_XMM1_Da;
  int in_stack_00000008;
  int ret;
  Option *in_stack_00000040;
  float in_stack_0000004c;
  undefined4 in_stack_00000054;
  Option *in_stack_00000660;
  bool in_stack_00000669;
  bool in_stack_0000066a;
  bool in_stack_0000066b;
  float in_stack_0000066c;
  Mat *in_stack_00000670;
  Mat *in_stack_00000678;
  Option *in_stack_00000770;
  bool in_stack_00000779;
  bool in_stack_0000077a;
  bool in_stack_0000077b;
  float in_stack_0000077c;
  Mat *in_stack_00000780;
  Mat *in_stack_00000788;
  int local_28;
  
  if (in_stack_00000008 == 0) {
    local_28 = reduction_op<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>>
                         (in_stack_00000678,in_stack_00000670,in_stack_0000066c,in_stack_0000066b,
                          in_stack_0000066a,in_stack_00000669,in_stack_00000660);
  }
  else {
    local_28 = reduction_op_keepdims<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>>
                         (in_stack_00000788,in_stack_00000780,in_stack_0000077c,in_stack_0000077b,
                          in_stack_0000077a,in_stack_00000779,in_stack_00000770);
  }
  if (local_28 == 0) {
    if (((in_R9B & 1) != 0) ||
       (dVar2 = std::fabs((double)(ulong)(uint)(in_XMM1_Da - 1.0)), 1.1920929e-07 < SUB84(dVar2,0)))
    {
      iVar1 = reduction_post_process<ncnn::post_process_identity<float>>
                        ((Mat *)CONCAT44(in_stack_00000054,keepdims),in_stack_0000004c,
                         in_stack_00000040);
      if (iVar1 != 0) {
        return -100;
      }
      local_28 = 0;
    }
    return local_28;
  }
  return -100;
}

Assistant:

static int reduction(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, bool post_process, float coeff, int keepdims, const Option& opt)
{
    int ret;
    if (keepdims)
        ret = reduction_op_keepdims<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    else
        ret = reduction_op<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    if (ret != 0)
        return -100;

    if (post_process || fabs(coeff - 1.f) > FLT_EPSILON)
    {
        ret = reduction_post_process<Op3>(b, coeff, opt);
        if (ret != 0)
            return -100;
    }
    return ret;
}